

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     popa<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Context *context)

{
  Memory *this;
  uint16_t *puVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  type_conflict2 tVar8;
  
  this = &context->memory;
  tVar8 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (this,SS,(context->registers).sp_);
  uVar2 = (context->registers).sp_;
  (context->registers).sp_ = uVar2 + 2;
  (context->registers).di_ = tVar8;
  tVar8 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (this,SS,uVar2 + 2);
  uVar3 = (context->registers).sp_;
  (context->registers).sp_ = uVar3 + 2;
  (context->registers).si_ = tVar8;
  tVar8 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (this,SS,uVar3 + 2);
  uVar4 = (context->registers).sp_;
  (context->registers).bp_ = tVar8;
  (context->registers).sp_ = uVar4 + 4;
  tVar8 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (this,SS,uVar4 + 4);
  uVar5 = (context->registers).sp_;
  (context->registers).sp_ = uVar5 + 2;
  (context->registers).bx_.full = tVar8;
  tVar8 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (this,SS,uVar5 + 2);
  uVar6 = (context->registers).sp_;
  (context->registers).sp_ = uVar6 + 2;
  (context->registers).dx_.full = tVar8;
  tVar8 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (this,SS,uVar6 + 2);
  uVar7 = (context->registers).sp_;
  (context->registers).sp_ = uVar7 + 2;
  (context->registers).cx_.full = tVar8;
  tVar8 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (this,SS,uVar7 + 2);
  puVar1 = &(context->registers).sp_;
  *puVar1 = *puVar1 + 2;
  (context->registers).ax_.full = tVar8;
  return;
}

Assistant:

void popa(
	ContextT &context
) {
	context.memory.preauthorise_stack_read(sizeof(IntT) * 8);
	if constexpr (std::is_same_v<IntT, uint32_t>) {
		context.registers.edi() = pop<uint32_t, true>(context);
		context.registers.esi() = pop<uint32_t, true>(context);
		context.registers.ebp() = pop<uint32_t, true>(context);
		context.registers.esp() += 4;
		context.registers.ebx() = pop<uint32_t, true>(context);
		context.registers.edx() = pop<uint32_t, true>(context);
		context.registers.ecx() = pop<uint32_t, true>(context);
		context.registers.eax() = pop<uint32_t, true>(context);
	} else {
		context.registers.di() = pop<uint16_t, true>(context);
		context.registers.si() = pop<uint16_t, true>(context);
		context.registers.bp() = pop<uint16_t, true>(context);
		context.registers.sp() += 2;
		context.registers.bx() = pop<uint16_t, true>(context);
		context.registers.dx() = pop<uint16_t, true>(context);
		context.registers.cx() = pop<uint16_t, true>(context);
		context.registers.ax() = pop<uint16_t, true>(context);
	}
}